

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall spoa::Graph::Edge::AddSequence(Edge *this,uint32_t label,uint32_t w)

{
  uint32_t local_14;
  uint32_t w_local;
  uint32_t label_local;
  Edge *this_local;
  
  local_14 = label;
  _w_local = this;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->labels,&local_14);
  this->weight = (ulong)w + this->weight;
  return;
}

Assistant:

void Graph::Edge::AddSequence(std::uint32_t label, std::uint32_t w) {
  labels.emplace_back(label);
  weight += w;
}